

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O1

void __thiscall
soul::ResolutionPass::FunctionResolver::throwErrorForUnknownFunction
          (FunctionResolver *this,CallOrCast *call,QualifiedIdentifier *name)

{
  IdentifierPath *this_00;
  Scope *this_01;
  ASTObject *pAVar1;
  CommaSeparatedList *pCVar2;
  CallOrCast *pCVar3;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  int line;
  long lVar7;
  char *location;
  size_t sVar8;
  char *message;
  Context *this_02;
  long lVar9;
  long lVar10;
  string possibleFunction;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_290;
  FunctionResolver *local_238;
  CallOrCast *local_230;
  undefined1 local_228 [40];
  uint64_t local_200;
  uint64_t local_1f8;
  pool_ref<soul::AST::ASTObject> local_1f0 [8];
  ArrayWithPreallocation<soul::Identifier,_8UL> local_1b0;
  undefined1 local_158;
  undefined8 local_154;
  undefined1 local_14c;
  undefined2 local_14b;
  undefined1 local_149;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  local_228._32_8_ = local_1f0;
  local_200 = 0;
  local_1f8 = 8;
  local_1b0.items = (Identifier *)local_1b0.space;
  local_1b0.numActive = 0;
  local_1b0.numAllocated = 8;
  local_158 = 0;
  local_154 = 0x1010101ffffffff;
  local_14c = 1;
  local_14b = 0x100;
  local_149 = 0;
  this_00 = &name->pathPrefix;
  IdentifierPath::operator+
            ((IdentifierPath *)&local_290,this_00,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  local_238 = this;
  local_230 = call;
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_1b0,&local_290);
  local_290.numActive = 0;
  if (8 < local_290.numAllocated) {
    if (local_290.items != (Identifier *)0x0) {
      operator_delete__(local_290.items);
    }
    local_290.items = (Identifier *)local_290.space;
    local_290.numAllocated = 8;
  }
  local_158 = 1;
  local_14c = 1;
  local_154 = CONCAT44(0x1010101,(undefined4)local_154);
  local_14b = 0x100;
  this_01 = (name->super_Expression).super_Statement.super_ASTObject.context.parentScope;
  if (this_01 != (Scope *)0x0) {
    AST::Scope::performFullNameSearch(this_01,(NameSearch *)(local_228 + 0x20),(Statement *)0x0);
  }
  IdentifierPath::operator+
            ((IdentifierPath *)&local_290,this_00,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  sVar8 = local_290.numActive;
  local_290.numActive = 0;
  if (8 < local_290.numAllocated) {
    if (local_290.items != (Identifier *)0x0) {
      operator_delete__(local_290.items);
    }
    local_290.items = (Identifier *)local_290.space;
    local_290.numAllocated = 8;
  }
  if (sVar8 == 1) {
    if (local_1b0.numActive == 0) {
      throwInternalCompilerError("! empty()","back",0xaa);
    }
    IdentifierPath::withSuffix
              ((IdentifierPath *)&local_290,
               &((local_238->super_ErrorIgnoringRewritingASTVisitor).owner)->intrinsicsNamespacePath
               ,local_1b0.items[local_1b0.numActive - 1].name);
    ArrayWithPreallocation<soul::Identifier,_8UL>::operator=(&local_1b0,&local_290);
    pCVar3 = local_230;
    local_290.numActive = 0;
    if (8 < local_290.numAllocated) {
      if (local_290.items != (Identifier *)0x0) {
        operator_delete__(local_290.items);
      }
      local_290.items = (Identifier *)local_290.space;
      local_290.numAllocated = 8;
    }
    AST::Scope::performFullNameSearch
              ((pCVar3->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
               context.parentScope,(NameSearch *)(local_228 + 0x20),(Statement *)0x0);
  }
  uVar4 = local_228._32_8_;
  if (local_200 != 0) {
    lVar10 = local_200 << 3;
    lVar9 = 0;
    lVar7 = 0;
    do {
      lVar5 = *(long *)((long)(ASTObject **)uVar4 + lVar9);
      if (lVar5 == 0) {
        uVar6 = 0;
      }
      else {
        lVar5 = __dynamic_cast(lVar5,&AST::ASTObject::typeinfo,&AST::Function::typeinfo,0);
        uVar6 = (ulong)(lVar5 != 0);
      }
      pCVar3 = local_230;
      lVar7 = lVar7 + uVar6;
      lVar9 = lVar9 + 8;
    } while (lVar10 != lVar9);
    if (lVar7 != 0) {
      IdentifierPath::operator+
                ((IdentifierPath *)&local_290,this_00,
                 &((name->pathSections).
                   super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   ._M_impl.super__Vector_impl_data._M_start)->path);
      pCVar2 = (pCVar3->super_CallOrCastBase).arguments.object;
      if (pCVar2 == (CommaSeparatedList *)0x0) {
        sVar8 = 0;
      }
      else {
        sVar8 = (pCVar2->items).numActive;
      }
      std::__cxx11::to_string((string *)local_228,sVar8);
      CompileMessageHelpers::createMessage<soul::IdentifierPath,std::__cxx11::string>
                (&local_68,(CompileMessageHelpers *)0x1,none,0x286774,(char *)&local_290,
                 (IdentifierPath *)local_228,in_stack_fffffffffffffd58);
      AST::Context::throwError
                (&(name->super_Expression).super_Statement.super_ASTObject.context,&local_68,false);
    }
    pAVar1 = *(ASTObject **)uVar4;
    if (pAVar1 == (ASTObject *)0x0) {
      lVar7 = 0;
    }
    else {
      lVar7 = __dynamic_cast(pAVar1,&AST::ASTObject::typeinfo,&AST::Processor::typeinfo,0);
      if (lVar7 != 0) {
        CompileMessageHelpers::createMessage<>
                  (&local_a0,syntax,error,"Cannot use a processor name as a function call");
        AST::Context::throwError
                  (&(name->super_Expression).super_Statement.super_ASTObject.context,&local_a0,false
                  );
      }
      if (pAVar1 == (ASTObject *)0x0) {
        lVar7 = 0;
      }
      else {
        lVar7 = __dynamic_cast(pAVar1,&AST::ASTObject::typeinfo,&AST::EndpointDeclaration::typeinfo,
                               0);
      }
    }
    if (lVar7 != 0) {
      if (*(char *)(lVar7 + 0x28) == '\x01') {
        CompileMessageHelpers::createMessage<>
                  (&local_148,syntax,error,"Cannot use an input as a function call");
      }
      else {
        CompileMessageHelpers::createMessage<>
                  (&local_148,syntax,error,"Cannot use an output as a function call");
      }
      AST::Context::throwError
                (&(name->super_Expression).super_Statement.super_ASTObject.context,&local_148,false)
      ;
    }
  }
  IdentifierPath::operator+
            ((IdentifierPath *)&local_290,this_00,
             &((name->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  if (local_290.numActive == 0) {
    line = 0xaa;
    location = "back";
    message = "! empty()";
  }
  else {
    if (local_290.items[local_290.numActive - 1].name != (string *)0x0) {
      findPossibleMisspeltFunction
                ((string *)local_228,local_238,local_290.items[local_290.numActive - 1].name);
      local_290.numActive = 0;
      if (8 < local_290.numAllocated) {
        if (local_290.items != (Identifier *)0x0) {
          operator_delete__(local_290.items);
        }
        local_290.items = (Identifier *)local_290.space;
        local_290.numAllocated = 8;
      }
      this_02 = &(name->super_Expression).super_Statement.super_ASTObject.context;
      if (local_228._8_8_ == 0) {
        IdentifierPath::operator+
                  ((IdentifierPath *)&local_290,this_00,
                   &((name->pathSections).
                     super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                     ._M_impl.super__Vector_impl_data._M_start)->path);
        CompileMessageHelpers::createMessage<soul::IdentifierPath>
                  (&local_110,syntax,error,"Unknown function: $Q0$",(IdentifierPath *)&local_290);
        AST::Context::throwError(this_02,&local_110,false);
      }
      IdentifierPath::operator+
                ((IdentifierPath *)&local_290,this_00,
                 &((name->pathSections).
                   super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   ._M_impl.super__Vector_impl_data._M_start)->path);
      CompileMessageHelpers::createMessage<soul::IdentifierPath,std::__cxx11::string&>
                (&local_d8,(CompileMessageHelpers *)0x1,none,0x286822,(char *)&local_290,
                 (IdentifierPath *)local_228,in_stack_fffffffffffffd58);
      AST::Context::throwError(this_02,&local_d8,false);
    }
    line = 0x21;
    location = "operator const std::basic_string<char> &";
    message = "isValid()";
  }
  throwInternalCompilerError(message,location,line);
}

Assistant:

void throwErrorForUnknownFunction (AST::CallOrCast& call, AST::QualifiedIdentifier& name)
        {
            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = name.getPath();
            search.stopAtFirstScopeWithResults = true;
            search.findVariables = true;
            search.findTypes = true;
            search.findFunctions = true;
            search.findNamespaces = true;
            search.findProcessors = true;
            search.findProcessorInstances = false;
            search.findEndpoints = true;

            if (auto scope = name.getParentScope())
                scope->performFullNameSearch (search, nullptr);

            if (name.getPath().isUnqualified())
            {
                search.partiallyQualifiedPath = owner.intrinsicsNamespacePath.withSuffix (search.partiallyQualifiedPath.getLastPart());
                call.getParentScope()->performFullNameSearch (search, nullptr);
            }

            size_t numFunctions = 0;

            for (auto& i : search.itemsFound)
                if (is_type<AST::Function> (i))
                    ++numFunctions;

            if (numFunctions > 0)
                name.context.throwError (Errors::noFunctionWithNumberOfArgs (name.getPath(),
                                                                             std::to_string (call.getNumArguments())));

            if (! search.itemsFound.empty())
            {
                if (is_type<AST::Processor> (search.itemsFound.front()))
                    name.context.throwError (Errors::cannotUseProcessorAsFunction());

                if (auto e = cast<AST::EndpointDeclaration> (search.itemsFound.front()))
                    name.context.throwError (e->isInput ? Errors::cannotUseInputAsFunction()
                                                        : Errors::cannotUseOutputAsFunction());
            }

            auto possibleFunction = findPossibleMisspeltFunction (name.getPath().getLastPart());

            if (! possibleFunction.empty())
                name.context.throwError (Errors::unknownFunctionWithSuggestion (name.getPath(), possibleFunction));

            name.context.throwError (Errors::unknownFunction (name.getPath()));
        }